

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O1

void weffects(obj *obj,schar dx,schar dy,schar dz)

{
  byte bVar1;
  short sVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  xchar x;
  xchar y;
  boolean bVar6;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  trap *ptVar10;
  char *pcVar11;
  obj *obj_00;
  engr *peVar12;
  char *pcVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  xchar cnt;
  int tmp;
  char *pcVar17;
  int iVar18;
  level *plVar19;
  obj *in_stack_fffffffffffffe98;
  int yy;
  int xx;
  d_level *local_150;
  trap *local_148;
  long local_140;
  char local_138 [264];
  
  lVar15 = (long)obj->otyp;
  bVar1 = objects[lVar15].field_0x10;
  local_140 = lVar15;
  exercise(2,'\x01');
  y = u.uy;
  x = u.ux;
  if ((((u.usteed != (monst *)0x0) && ('\0' < dz)) && (dy == '\0' && dx == '\0')) &&
     ((*(ushort *)&objects[lVar15].field_0x11 & 0xc) != 4)) {
    uVar14 = (ushort)obj->otyp - 0x185;
    if (0x1c < uVar14) {
LAB_00293fba:
      uVar14 = (ushort)obj->otyp - 0x1c4;
      if (uVar14 < 0xb) {
        if ((0x16fU >> (uVar14 & 0x1f) & 1) != 0) goto LAB_00293fce;
        if (uVar14 == 7) goto LAB_002941f3;
        if (uVar14 == 10) {
          probe_monster(u.usteed);
          iVar16 = 0x1ce;
          goto LAB_00294256;
        }
      }
      goto LAB_00293ff8;
    }
    if ((0x12021067U >> (uVar14 & 0x1f) & 1) == 0) {
      if (uVar14 != 0x1a) goto LAB_00293fba;
LAB_002941f3:
      tele((char *)0x0);
      if (((u.uprops[0xf].extrinsic == 0 && u.uprops[0xf].intrinsic == 0) &&
          (((youmonst.data)->mflags1 & 0x4000000) == 0)) && ((viz_array[u.uy0][u.ux0] & 1U) != 0)) {
        iVar16 = dist2((int)u.ux0,(int)u.uy0,(int)u.ux,(int)u.uy);
        bVar3 = true;
        if (iVar16 < 0x10) goto LAB_00294278;
      }
      iVar16 = (int)obj->otyp;
LAB_00294256:
      discover_object(iVar16,'\x01','\x01');
    }
    else {
LAB_00293fce:
      bhitm(u.usteed,obj);
    }
    goto LAB_00294275;
  }
LAB_00293ff8:
  uVar7 = *(ushort *)&objects[lVar15].field_0x11 >> 2 & 3;
  if (uVar7 == 1) {
    zapnodir(obj);
    bVar3 = false;
    goto LAB_00294278;
  }
  if (uVar7 != 2) {
    uVar14 = (uint)local_140;
    if ((uVar14 == 0x1cf) || ((uVar14 & 0xffff) == 0x17d)) {
      zap_dig(dx,dy,dz);
    }
    else {
      if ((ushort)((short)local_140 - 0x17eU) < 5) {
        iVar16 = uVar14 - 0x174;
        iVar18 = u.ulevel / 2 + 1;
      }
      else {
        iVar16 = uVar14 - 0x1d0;
        if (5 < (ushort)iVar16) {
          warning("weffects: unexpected spell or wand");
          goto LAB_00294275;
        }
        iVar18 = (uint)(uVar14 != 0x1d0) * 4 + 2;
      }
      buzz(iVar16,iVar18,u.ux,u.uy,(int)dx,(int)dy);
    }
LAB_00294275:
    bVar3 = true;
    goto LAB_00294278;
  }
  obj_zapped = '\0';
  if ((u._1052_1_ & 1) == 0) {
    if (dz == '\0') {
      uVar14 = mt_random();
      bVar3 = false;
      beam_hit((int)dx,(int)dy,(uVar14 & 7) + 6,0,bhitm,bhito,obj,(boolean *)0x0);
    }
    else {
      iVar18 = (int)u.ux;
      iVar16 = (int)u.uy;
      yy = iVar16;
      xx = iVar18;
      ptVar10 = t_at(level,iVar18,iVar16);
      uVar7 = obj->otyp;
      bVar5 = true;
      bVar3 = false;
      bVar4 = false;
      if (uVar7 < 0x1c4) {
        if (uVar7 < 0x18c) {
          if (uVar7 == 0x186) {
LAB_002941b4:
            bVar6 = is_db_wall(iVar18,iVar16);
            if ((bVar6 == '\0') || (bVar6 = find_drawbridge(&xx,&yy), bVar6 == '\0')) {
              if ((((dz < '\x01') || (x != (level->dnstair).sx)) || (y != (level->dnstair).sy)) ||
                 ((bVar6 = on_level(&u.uz,&dungeon_topology.d_qstart_level), bVar6 == '\0' ||
                  (bVar6 = ok_to_quest(), bVar6 != '\0')))) goto LAB_00294852;
              pline("The stairs seem to ripple momentarily.");
            }
            else {
              open_drawbridge(xx,yy);
            }
LAB_00294598:
            bVar3 = true;
          }
          else if (uVar7 == 0x187) goto LAB_002943bb;
        }
        else {
          bVar3 = false;
          if (uVar7 == 0x18c) goto LAB_002943c0;
          bVar3 = bVar4;
          if (uVar7 == 0x1a4) {
            bVar6 = on_level(&u.uz,&dungeon_topology.d_air_level);
            if (((bVar6 == '\0') &&
                (bVar6 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar6 == '\0')) &&
               (((u._1052_1_ & 2) == 0 &&
                ((bVar6 = on_level(&u.uz,&dungeon_topology.d_qstart_level), -1 < dz ||
                 (bVar6 == '\0')))))) {
              if (dz < '\0') {
                pcVar17 = body_part(2);
                pline("Blood drips on your %s.",pcVar17);
                bVar3 = false;
              }
              else {
                if ((level->objects[u.ux][u.uy] != (obj *)0x0) ||
                   ((peVar12 = engr_at(level,u.ux,u.uy), peVar12 != (engr *)0x0 &&
                    (peVar12->engr_type == '\x02')))) goto LAB_00294852;
                bVar6 = is_pool(level,(int)u.ux,(int)u.uy);
                if ((bVar6 != '\0') || (bVar6 = is_ice(level,(int)u.ux,(int)u.uy), bVar6 != '\0'))
                goto LAB_00294332;
                bVar6 = is_lava(level,(int)u.ux,(int)u.uy);
                pcVar17 = "boil";
                if (bVar6 == '\0') {
                  pcVar17 = "pool";
                }
                if (u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) {
                  pcVar11 = "at";
                  if ((youmonst.data)->mlet == '\x05') {
                    pcVar11 = "beneath";
                  }
                }
                else {
                  pcVar11 = "beneath";
                }
                pcVar13 = body_part(5);
                pcVar13 = makeplural(pcVar13);
                pline("Blood %ss %s your %s.",pcVar17,pcVar11,pcVar13);
                bVar3 = false;
              }
            }
            else {
LAB_00294332:
              pline("Nothing happens.");
              bVar3 = false;
            }
          }
        }
      }
      else if (uVar7 < 0x1cd) {
        if (uVar7 == 0x1c4) {
LAB_002943bb:
          bVar5 = false;
          bVar3 = true;
LAB_002943c0:
          local_148 = ptVar10;
          if (level->locations[iVar18][iVar16].typ == '$') {
            if ('\0' < dz) {
LAB_002943f0:
              if (bVar5) {
                close_drawbridge(xx,yy);
              }
              else {
                destroy_drawbridge(xx,yy);
              }
              goto LAB_00294598;
            }
          }
          else {
            iVar8 = is_drawbridge_wall(iVar18,iVar16);
            if (((iVar8 != 0) && (bVar6 = is_db_wall(iVar18,iVar16), bVar6 == '\0')) &&
               (bVar6 = find_drawbridge(&xx,&yy), bVar6 != '\0')) goto LAB_002943f0;
          }
          if ((bVar3 && dz < '\0') && (uVar14 = mt_random(), 0x55555555 < uVar14 * -0x55555555)) {
            local_150 = &u.uz;
            bVar6 = on_level(&u.uz,&dungeon_topology.d_air_level);
            if (((bVar6 == '\0') &&
                ((bVar6 = on_level(local_150,&dungeon_topology.d_water_level), bVar6 == '\0' &&
                 ((u._1052_1_ & 2) == 0)))) &&
               (bVar6 = on_level(local_150,&dungeon_topology.d_qstart_level), bVar6 == '\0')) {
              pcVar17 = ceiling(iVar18,iVar16);
              pcVar11 = body_part(8);
              pline("A rock is dislodged from the %s and falls on your %s.",pcVar17,pcVar11);
              uVar14 = 6;
              if ((uarmh != (obj *)0x0) &&
                 (uVar7 = *(ushort *)&objects[uarmh->otyp].field_0x11 >> 4 & 0x1f, 10 < uVar7)) {
                uVar14 = (uint)(0x11 < uVar7) * 4 + 2;
              }
              uVar9 = mt_random();
              losehp(uVar9 % uVar14 + 1,"falling rock",0);
              obj_00 = mksobj_at(0x213,level,iVar18,iVar16,'\0','\0');
              if (obj_00 != (obj *)0x0) {
                xname(obj_00);
                stackobj(in_stack_fffffffffffffe98);
              }
              newsym(iVar18,iVar16);
              goto LAB_00294852;
            }
          }
          if ((bool)(bVar5 & local_148 != (trap *)0x0)) {
            bVar3 = false;
            if (('\0' < dz) && ((local_148->field_0x8 & 0x1f) == 0xe)) {
              if (((u.uprops[0x1e].intrinsic == 0) &&
                  (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                   (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                 ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
                if ((local_148->field_0x8 & 0x20) == 0) {
                  bVar6 = is_ice(level,iVar18,iVar16);
                  pcVar17 = "frost";
                  if (bVar6 == '\0') {
                    pcVar17 = "dust";
                  }
                  bVar3 = false;
                  pline("You see a swirl of %s beneath you.",pcVar17);
                }
                else {
                  pline("A trap door beneath you closes up then vanishes.");
                  bVar3 = true;
                }
              }
              else {
                bVar3 = false;
                You_hear("a twang followed by a thud.");
              }
              deltrap(level,local_148);
              newsym(iVar18,iVar16);
            }
          }
          else {
LAB_00294852:
            bVar3 = false;
          }
        }
        else {
          bVar3 = bVar4;
          if (uVar7 == 0x1cc) goto LAB_002941b4;
        }
      }
      else {
        if (uVar7 == 0x1cd) goto LAB_002943c0;
        bVar3 = bVar4;
        if (uVar7 == 0x1ce) {
          if (dz < '\0') {
            pcVar17 = ceiling(iVar18,iVar16);
            pline("You probe towards the %s.",pcVar17);
          }
          else {
            iVar8 = bhitpile(obj,bhito,iVar18,iVar16);
            pcVar17 = surface(iVar18,iVar16);
            pline("You probe beneath the %s.",pcVar17);
            iVar16 = display_binventory(iVar18,iVar16,'\x01');
            bVar3 = true;
            if (iVar16 + iVar8 != 0) goto switchD_002948cc_caseD_1a0;
          }
          pline("Your probe reveals nothing.");
          bVar3 = true;
          goto switchD_002948cc_caseD_1a0;
        }
      }
      if ('\0' < dz) {
        bhitpile(obj,bhito,iVar18,iVar16);
        peVar12 = engr_at(level,x,y);
        plVar19 = level;
        if ((peVar12 != (engr *)0x0) && (peVar12->engr_type != '\x06')) {
          sVar2 = obj->otyp;
          switch(sVar2) {
          case 0x1c4:
switchD_0029492b_caseD_1c4:
            iVar16 = 2;
            iVar18 = -2;
            do {
              uVar14 = mt_random();
              iVar16 = iVar16 + (uVar14 & 3);
              cnt = (xchar)iVar16;
              iVar18 = iVar18 + 1;
            } while (iVar18 != 0);
LAB_00294a14:
            wipe_engr_at(plVar19,x,y,cnt);
            break;
          case 0x1c5:
          case 0x1ca:
switchD_002948cc_caseD_1a1:
            del_engr(level,peVar12);
            break;
          case 0x1c6:
          case 0x1c7:
          case 0x1c8:
            break;
          case 0x1c9:
switchD_002948cc_caseD_19e:
            del_engr(level,peVar12);
            plVar19 = level;
            pcVar17 = random_engraving(local_138);
            make_engr_at(plVar19,iVar18,iVar16,pcVar17,(ulong)moves,'\0');
            break;
          case 0x1cb:
switchD_002948cc_caseD_19f:
            rloc_engr(peVar12);
            break;
          default:
            switch(sVar2) {
            case 0x19e:
              goto switchD_002948cc_caseD_19e;
            case 0x19f:
              goto switchD_002948cc_caseD_19f;
            case 0x1a0:
            case 0x1a2:
            case 0x1a3:
              break;
            case 0x1a1:
              goto switchD_002948cc_caseD_1a1;
            case 0x1a4:
              if (peVar12->engr_type == '\x02') {
                pcVar17 = "The edges on the floor get smoother.";
                if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
                  if (u.umonnum == u.umonster) {
                    pcVar17 = "The floor runs like butter!";
                  }
                  else {
                    bVar6 = dmgtype(youmonst.data,0x24);
                    pcVar17 = "The edges on the floor get smoother.";
                    if (bVar6 == '\0') {
                      pcVar17 = "The floor runs like butter!";
                    }
                  }
                }
                pline(pcVar17);
                plVar19 = level;
                iVar16 = 2;
                iVar18 = -2;
                do {
                  uVar14 = mt_random();
                  iVar16 = iVar16 + (uVar14 & 3);
                  cnt = (xchar)iVar16;
                  iVar18 = iVar18 + 1;
                } while (iVar18 != 0);
                goto LAB_00294a14;
              }
              break;
            default:
              if (sVar2 == 0x187) goto switchD_0029492b_caseD_1c4;
            }
          }
        }
      }
    }
  }
  else {
    bhitm(u.ustuck,obj);
    bVar3 = false;
  }
switchD_002948cc_caseD_1a0:
  if (obj_zapped == '\x01') {
    pline("You feel shuddering vibrations.");
  }
LAB_00294278:
  if ((bVar3) && ((bVar1 & 1) == 0)) {
    discover_object((int)local_140,'\x01','\x01');
    more_experienced(0,0,10);
  }
  return;
}

Assistant:

void weffects(struct obj *obj, schar dx, schar dy, schar dz)
{
	int otyp = obj->otyp;
	boolean disclose = FALSE, was_unkn = !objects[otyp].oc_name_known;

	exercise(A_WIS, TRUE);
	if (u.usteed && (objects[otyp].oc_dir != NODIR) &&
	    !dx && !dy && (dz > 0) && zap_steed(obj)) {
		disclose = TRUE;
	} else if (objects[otyp].oc_dir == IMMEDIATE) {
	    obj_zapped = FALSE;

	    if (u.uswallow) {
		bhitm(u.ustuck, obj);
		/* [how about `bhitpile(u.ustuck->minvent)' effect?] */
	    } else if (dz) {
		disclose = zap_updown(obj, dz);
	    } else {
		beam_hit(dx, dy, rn1(8,6), ZAPPED_WAND, bhitm, bhito, obj, NULL);
	    }
	    /* give a clue if obj_zapped */
	    if (obj_zapped)
		pline("You feel shuddering vibrations.");

	} else if (objects[otyp].oc_dir == NODIR) {
	    zapnodir(obj);

	} else {
	    /* neither immediate nor directionless */

	    if (otyp == WAN_DIGGING || otyp == SPE_DIG)
		zap_dig(dx, dy, dz);
	    else if (otyp >= SPE_MAGIC_MISSILE && otyp <= SPE_FINGER_OF_DEATH)
		buzz(otyp - SPE_MAGIC_MISSILE + 10,
		     u.ulevel / 2 + 1,
		     u.ux, u.uy, dx, dy);
	    else if (otyp >= WAN_MAGIC_MISSILE && otyp <= WAN_LIGHTNING)
		buzz(otyp - WAN_MAGIC_MISSILE,
		     (otyp == WAN_MAGIC_MISSILE) ? 2 : 6,
		     u.ux, u.uy, dx, dy);
	    else
		warning("weffects: unexpected spell or wand");
	    disclose = TRUE;
	}
	if (disclose && was_unkn) {
	    makeknown(otyp);
	    more_experienced(0, 0, 10);
	}
	return;
}